

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsMessage::TadsMessage(TadsMessage *this,char *typ,OS_Event *quit_evt)

{
  void *pvVar1;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int in_stack_ffffffffffffffdc;
  OS_Event *in_stack_ffffffffffffffe0;
  
  CVmRefCntObj::CVmRefCntObj((CVmRefCntObj *)0x253ed1);
  *in_RDI = &PTR__TadsMessage_0042b978;
  in_RDI[2] = in_RSI;
  in_RDI[3] = 0;
  pvVar1 = operator_new(0x88);
  OS_Event::OS_Event(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  in_RDI[4] = pvVar1;
  *(undefined4 *)(in_RDI + 6) = 0;
  in_RDI[5] = in_RDX;
  if (in_RDX != 0) {
    CVmRefCntObj::add_ref((CVmRefCntObj *)0x253f3c);
  }
  return;
}

Assistant:

TadsMessage(const char *typ, OS_Event *quit_evt)
    {
        /* remember the message type */
        this->typ = typ;
        
        /* we're not in a queue yet */
        nxt = 0;

        /* set up an event to signal completion of the message */
        ev = new OS_Event(FALSE);
        completed = FALSE;

        /* remember the quit event */
        if ((this->quit_evt = quit_evt) != 0)
            quit_evt->add_ref();
    }